

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

void Am_Inter_Start_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *param_3,Am_Input_Event *ev)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  
  pAVar3 = Am_Object::Get(inter,0xcb,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    Am_Object::Set(inter,0x123,0,1);
    return;
  }
  pAVar3 = Am_Object::Get(inter,0x123,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  if (iVar2 == 1) {
    return;
  }
  Am_Object::Set(inter,0x123,1,1);
  Am_Object::Set(inter,0x1f2,&ev->user_id,1);
  change_priority_level(inter,false,true);
  set_want_move(inter,true);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Inter_Start_Method,
                 (Am_Object & inter, Am_Object &object,
                  Am_Object & /* event_window */, Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Interactor starting over " << object);

  // now set up states.  It is up to the sub-classes to call the
  // command or object function appropriately

  if ((bool)inter.Get(Am_CONTINUOUS)) {
    if ((int)inter.Get(Am_CURRENT_STATE) != (int)Am_INTER_RUNNING) {
      inter.Set(Am_CURRENT_STATE, (int)Am_INTER_RUNNING, Am_OK_IF_NOT_THERE);
      inter.Set(Am_INTERNAL_USER_ID, ev->user_id,
                Am_OK_IF_NOT_THERE); // supports multiple users
      change_priority_level(inter, false, true);
      set_want_move(inter, true);
    }
    //otherwise, it is already running
  } else { // not continuous
    inter.Set(Am_CURRENT_STATE, (int)Am_INTER_WAITING, Am_OK_IF_NOT_THERE);
  }
}